

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.cpp
# Opt level: O2

ssize_t __thiscall Tag::read(Tag *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer ppSVar1;
  StreamObject *pSVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined7 extraout_var;
  undefined4 extraout_var_00;
  ostream *unaff_RBP;
  ulong uVar6;
  undefined4 in_register_00000034;
  stringstream *f;
  int j;
  int iVar7;
  int i;
  long lVar8;
  uint uVar9;
  uint local_200;
  int local_1fc;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream stream;
  ostream local_1a8 [376];
  
  f = (stringstream *)CONCAT44(in_register_00000034,__fd);
  this->_numberOfLines = 0;
  bVar3 = getOpenTag(this,f);
  local_200 = (uint)bVar3;
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  local_1fc = 0;
  do {
    if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0) break;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    s._M_dataplus._M_p = (pointer)&s.field_2;
    std::operator>>((istream *)f,(string *)&s);
    bVar3 = getCloseTag(this,&s);
    if (bVar3) {
LAB_001060ba:
      bVar3 = false;
    }
    else if (((*s._M_dataplus._M_p == '<') && (s._M_dataplus._M_p[s._M_string_length - 1] == '>'))
            || (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) != 0)) {
      std::__cxx11::stringbuf::str();
      bVar3 = std::operator!=(&s,&local_1d8);
      unaff_RBP = (ostream *)(CONCAT71(extraout_var,bVar3) & 0xffffffff);
      std::__cxx11::string::~string((string *)&local_1d8);
      bVar3 = true;
      if ((char)unaff_RBP != '\0') {
        unaff_RBP = std::operator<<((ostream *)&std::cerr,"Syntax error: \"</");
        StreamObject::getName_abi_cxx11_(&local_1d8,&this->super_StreamObject);
        poVar5 = std::operator<<(unaff_RBP,(string *)&local_1d8);
        poVar5 = std::operator<<(poVar5,">\" missing.");
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&local_1d8);
        local_200 = 0;
        goto LAB_001060ba;
      }
    }
    else {
      poVar5 = std::operator<<(local_1a8,(string *)&s);
      std::endl<char,std::char_traits<char>>(poVar5);
      local_1fc = local_1fc + 1;
      bVar3 = true;
    }
    std::__cxx11::string::~string((string *)&s);
  } while (bVar3);
  if (local_200 == 0) {
LAB_001061d5:
    if ((local_200 & 1) != 0) {
      local_200 = (*(this->super_StreamObject)._vptr_StreamObject[3])(this);
    }
    if ((local_200 & 1) != 0) {
      uVar6 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      Object::setInitState(&(this->super_StreamObject).super_Object,true);
      goto LAB_001061fc;
    }
  }
  else {
    if (local_1fc % this->_lineSize == 0) {
      this->_numberOfLines = local_1fc / this->_lineSize;
      for (iVar7 = 1; iVar7 < this->_numberOfLines; iVar7 = iVar7 + 1) {
        for (lVar8 = 0; lVar8 < this->_lineSize; lVar8 = lVar8 + 1) {
          iVar4 = (*(this->_streamObjects).
                    super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8]->_vptr_StreamObject[2])();
          s._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar4);
          StreamObject::setOffset
                    ((StreamObject *)s._M_dataplus._M_p,this->_lineSize * iVar7 + (int)lVar8);
          std::vector<StreamObject_*,_std::allocator<StreamObject_*>_>::push_back
                    (&this->_streamObjects,(value_type *)&s);
        }
      }
      uVar9 = 0;
      while( true ) {
        ppSVar1 = (this->_streamObjects).
                  super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (((ulong)((long)(this->_streamObjects).
                           super__Vector_base<StreamObject_*,_std::allocator<StreamObject_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <=
             (ulong)uVar9) || ((local_200 & 1) == 0)) break;
        pSVar2 = ppSVar1[uVar9];
        local_200 = (*pSVar2->_vptr_StreamObject[1])(pSVar2,&stream);
        uVar9 = uVar9 + 1;
      }
      goto LAB_001061d5;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"Syntax error: wrong number of elements in \"<");
    StreamObject::getName_abi_cxx11_(&s,&this->super_StreamObject);
    poVar5 = std::operator<<(poVar5,(string *)&s);
    poVar5 = std::operator<<(poVar5,">\"-Tag.");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&s);
  }
  uVar6 = 0;
LAB_001061fc:
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return uVar6 & 0xffffffff;
}

Assistant:

bool Tag::read( std::stringstream &f )
{
	bool success = true;

	_numberOfLines = 0;

	success = getOpenTag( f );

	int numberOfElements = 0;

	std::stringstream stream;

	while ( ! f.eof() )
	{
		std::string s;
		f >> s;
		if ( getCloseTag( s ) )
		{
			break;
		}
		else
		{
			if (( s[0] == '<' ) && ( s[s.size()-1] == '>' ) || f.eof() )
			{
				if ( s != stream.str() )
				{
					std::cerr << "Syntax error: \"</" << getName() << ">\" missing." << std::endl;
					success = false;
					break;
				}
			}
			else
			{
				stream << s << std::endl;
				numberOfElements++;
			}
		}
	}

	if ( success )
	{
		if ( numberOfElements % lineSize() == 0 )
		{
			_numberOfLines = numberOfElements / lineSize();
		}
		else
		{
			std::cerr << "Syntax error: wrong number of elements in \"<" << getName() << ">\"-Tag." << std::endl;
			success = false;
		}
	}

	if ( success )
	{

		int offset = 0;

		for ( int j = 1; j < _numberOfLines; j++ )
		{
			for ( int i = 0; i < lineSize();i++ )
			{
				StreamObject *obj = elements()[i]->getInstance();

				offset = lineSize() * j;

				obj->setOffset( offset + i );

				elements().push_back( obj );
			}
		}

		for ( unsigned int i = 0; i < elements().size(); i++ )
		{
			if ( success )
			{
				success = _streamObjects[i]->read( stream );
			}
			else
			{
				break;
			}
		}
	}

	if ( success )
	{
		success = verify();
	}

	if ( success )
	{
		setInitState( true );
	}

	return success;
}